

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

string * __thiscall
flatbuffers::Parser::TokenToStringId_abi_cxx11_(string *__return_storage_ptr__,Parser *this,int t)

{
  pointer pcVar1;
  
  if (t == 0x104) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->super_ParserState).attribute_._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (this->super_ParserState).attribute_._M_string_length);
  }
  else {
    (anonymous_namespace)::TokenToString_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)(ulong)(uint)t,t);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::TokenToStringId(int t) const {
  return t == kTokenIdentifier ? attribute_ : TokenToString(t);
}